

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

dtime_t duckdb::Time::FromTime(int32_t hour,int32_t minute,int32_t second,int32_t microseconds)

{
  return (dtime_t)((long)microseconds +
                  ((long)second + ((long)minute + (long)hour * 0x3c) * 0x3c) * 1000000);
}

Assistant:

dtime_t Time::FromTime(int32_t hour, int32_t minute, int32_t second, int32_t microseconds) {
	int64_t result;
	result = hour;                                             // hours
	result = result * Interval::MINS_PER_HOUR + minute;        // hours -> minutes
	result = result * Interval::SECS_PER_MINUTE + second;      // minutes -> seconds
	result = result * Interval::MICROS_PER_SEC + microseconds; // seconds -> microseconds
	return dtime_t(result);
}